

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

int do_stackoverflow(int incallp)

{
  DLword DVar1;
  LispPTR LVar2;
  ulong uVar3;
  DLword *pDVar4;
  DLword *local_38;
  DLword *ac_freeptr;
  DLword *ac_ptr68k;
  int movedistance;
  DLword *oldPVar;
  DLword savenext;
  DLword newfx;
  int incallp_local;
  
  pDVar4 = MachineState.pvar;
  if (*NeedHardreturnCleanup_word != 0) {
    warn("HardreturnCleanup in do_stackoverflow");
  }
  if (incallp != 0) {
    oldPVar._4_2_ = MachineState.pvar[-5];
  }
  MachineState.csp = MachineState.csp + 2;
  DVar1 = StackOffsetFromNative(MachineState.csp);
  MachineState.pvar[-5] = DVar1;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((ulong)((long)MachineState.endofstack - (long)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("0-long free block.");
  }
  LVar2 = moveframe((FX *)(MachineState.pvar + -10));
  if ((LVar2 & 0xffff) == 0xffff) {
    MachineState.irqcheck = 0;
    MachineState.irqend = 0;
    _savenext = 1;
  }
  else {
    MachineState.pvar = (DLword *)NativeAligned4FromStackOffset((short)LVar2 + 10);
    uVar3 = (ulong)((long)MachineState.pvar - (long)pDVar4) >> 1;
    pDVar4 = NativeAligned2FromStackOffset(*(DLword *)((long)MachineState.pvar + -10));
    local_38 = pDVar4;
    if (*(short *)((ulong)pDVar4 ^ 2) != -0x6000) {
      error("pre_moveframe: MP9316");
    }
    while (*(short *)((ulong)local_38 ^ 2) == -0x6000) {
      MachineState.endofstack = local_38 + (int)(uint)*(ushort *)((ulong)(local_38 + 1) ^ 2);
      local_38 = MachineState.endofstack;
    }
    MachineState.csp = pDVar4 + -2;
    if (incallp != 0) {
      MachineState.pvar[-5] = oldPVar._4_2_ + (short)uVar3;
      MachineState.ivar = MachineState.ivar + (int)uVar3;
    }
    _savenext = 0;
  }
  return _savenext;
}

Assistant:

int do_stackoverflow(int incallp) {
  DLword newfx;
  DLword savenext;
  DLword *oldPVar;
  int movedistance;
#ifdef STACKCHECK
  LispPTR stackcontents;
  LispPTR TopIVAR;

  stackcontents = *((LispPTR *)CurrentStackPTR);
  TopIVAR = *((LispPTR *)IVar);
#endif

  /* Don't care PC,FuncObj, */
  /* if incall flag ON, don't care that IVar
       became residual, and it is pointed to by copied FX's BLINK */
  oldPVar = PVar;

  if (*NeedHardreturnCleanup_word) { warn("HardreturnCleanup in do_stackoverflow"); }
  if (incallp) { savenext = CURRENTFX->nextblock; /* save old nextblock */ }

  BEFORE_CONTEXTSW; /* Don't Use MIDPUNT and Don't care IFPAGE */

  /* Call MOVEFRAME directly */
  if ((newfx = (DLword)moveframe(CURRENTFX)) == 0xFFFF) {
    /* To make immediately call HARDRESET */
    Irq_Stk_Check = 0;
    Irq_Stk_End = 0;
    return (1); /* Whole space exhausted */
  }

  /* Return from MOVEFRAME directly */

  PVar = (DLword *)NativeAligned4FromStackOffset(newfx + FRAMESIZE);
  movedistance = ((UNSIGNED)PVar - (UNSIGNED)oldPVar) >> 1;
  AFTER_CONTEXTSW;

  if (incallp) {
    /* set next(it pointed to old IVar) with offset */
    CURRENTFX->nextblock = savenext + movedistance;

/* including Last Arg(kept in TOS */
#ifdef BIGVM
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr(CURRENTFX->fnheader),
            "in call, but stack frame doesn't match FN being executed.");
#else
    S_CHECK(FuncObj == (struct fnhead *)NativeAligned4FromLAddr((CURRENTFX->hi2fnheader << 16) |
                                                           CURRENTFX->lofnheader),
            "in call, but stack frame doesn't match FN being executed.");
#endif /* BIGVM */
    CHECK_FX(CURRENTFX);

    /* We should re-Set up IVAR,CURRENTFX->nextblock */
    IVar += movedistance;
  } /* incallp */

  return (0); /* Normal return */
  /* If  incallp ,we CAN continue executing FN or APPLY by just returning */
  /* new PVar will set in funcall */
}